

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O3

CURLcode dict_do(Curl_easy *data,_Bool *done)

{
  curl_trc_feat *pcVar1;
  CURLcode CVar2;
  int iVar3;
  char *in_RAX;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  CURLcode CVar7;
  char *pcVar8;
  char *path;
  char *local_38;
  
  *done = true;
  local_38 = in_RAX;
  CVar2 = Curl_urldecode((data->state).up.path,0,&local_38,(size_t *)0x0,REJECT_CTRL);
  if (CVar2 != CURLE_OK) {
    return CVar2;
  }
  iVar3 = curl_strnequal(local_38,"/MATCH:",7);
  if (((iVar3 == 0) && (iVar3 = curl_strnequal(local_38,"/M:",3), iVar3 == 0)) &&
     (iVar3 = curl_strnequal(local_38,"/FIND:",6), iVar3 == 0)) {
    iVar3 = curl_strnequal(local_38,"/DEFINE:",8);
    if (((iVar3 == 0) && (iVar3 = curl_strnequal(local_38,"/D:",3), iVar3 == 0)) &&
       (iVar3 = curl_strnequal(local_38,"/LOOKUP:",8), iVar3 == 0)) {
      pcVar4 = strchr(local_38,0x2f);
      if (pcVar4 != (char *)0x0) {
        pcVar5 = pcVar4 + 1;
        do {
          if (*pcVar5 == ':') {
            *pcVar5 = ' ';
          }
          else if (*pcVar5 == '\0') goto LAB_0012245d;
          pcVar5 = pcVar5 + 1;
        } while( true );
      }
      pcVar4 = (char *)0x0;
      CVar7 = CURLE_OK;
      goto LAB_0012240a;
    }
    pcVar4 = strchr(local_38,0x3a);
    if (pcVar4 == (char *)0x0) {
      pcVar5 = (char *)0x0;
LAB_0012238d:
      pcVar4 = "default";
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
      {
        Curl_infof(data,"lookup word is missing");
      }
    }
    else {
      pcVar4 = pcVar4 + 1;
      pcVar8 = strchr(pcVar4,0x3a);
      if (pcVar8 == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = pcVar8 + 1;
        *pcVar8 = '\0';
        pcVar8 = strchr(pcVar5,0x3a);
        if (pcVar8 != (char *)0x0) {
          *pcVar8 = '\0';
        }
      }
      if (*pcVar4 == '\0') goto LAB_0012238d;
    }
    if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
      pcVar5 = "!";
    }
    pcVar4 = unescape_word(pcVar4);
    if (pcVar4 == (char *)0x0) goto LAB_00122401;
    CVar2 = sendf(data,"CLIENT libcurl 8.10.1-DEV\r\nDEFINE %s %s\r\nQUIT\r\n",pcVar5);
  }
  else {
    pcVar4 = strchr(local_38,0x3a);
    if (pcVar4 == (char *)0x0) {
      pcVar5 = (char *)0x0;
      pcVar8 = (char *)0x0;
LAB_00122222:
      pcVar4 = "default";
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))))
      {
        Curl_infof(data,"lookup word is missing");
      }
    }
    else {
      pcVar4 = pcVar4 + 1;
      pcVar5 = strchr(pcVar4,0x3a);
      if (pcVar5 == (char *)0x0) {
        pcVar8 = (char *)0x0;
LAB_00122219:
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar8 = pcVar5 + 1;
        *pcVar5 = '\0';
        pcVar6 = strchr(pcVar8,0x3a);
        if (pcVar6 == (char *)0x0) goto LAB_00122219;
        pcVar5 = pcVar6 + 1;
        *pcVar6 = '\0';
        pcVar6 = strchr(pcVar5,0x3a);
        if (pcVar6 != (char *)0x0) {
          *pcVar6 = '\0';
        }
      }
      if (*pcVar4 == '\0') goto LAB_00122222;
    }
    if ((pcVar8 == (char *)0x0) || (*pcVar8 == '\0')) {
      pcVar8 = "!";
    }
    if ((pcVar5 == (char *)0x0) || (*pcVar5 == '\0')) {
      pcVar5 = ".";
    }
    pcVar4 = unescape_word(pcVar4);
    if (pcVar4 == (char *)0x0) {
LAB_00122401:
      CVar7 = CURLE_OUT_OF_MEMORY;
      goto LAB_00122407;
    }
    CVar2 = sendf(data,"CLIENT libcurl 8.10.1-DEV\r\nMATCH %s %s %s\r\nQUIT\r\n",pcVar8,pcVar5,
                  pcVar4);
  }
  CVar7 = CURLE_OK;
  if (CVar2 == CURLE_OK) {
    Curl_xfer_setup1(data,1,-1,false);
    goto LAB_0012240a;
  }
LAB_001222b8:
  CVar7 = CVar2;
  Curl_failf(data,"Failed sending DICT request");
LAB_0012240a:
  (*Curl_cfree)(pcVar4);
  (*Curl_cfree)(local_38);
  return CVar7;
LAB_0012245d:
  CVar7 = CURLE_OK;
  CVar2 = sendf(data,"CLIENT libcurl 8.10.1-DEV\r\n%s\r\nQUIT\r\n",pcVar4 + 1);
  if (CVar2 == CURLE_OK) {
    Curl_xfer_setup1(data,1,-1,false);
LAB_00122407:
    pcVar4 = (char *)0x0;
    goto LAB_0012240a;
  }
  pcVar4 = (char *)0x0;
  goto LAB_001222b8;
}

Assistant:

static CURLcode dict_do(struct Curl_easy *data, bool *done)
{
  char *word;
  char *eword = NULL;
  char *ppath;
  char *database = NULL;
  char *strategy = NULL;
  char *nthdef = NULL; /* This is not part of the protocol, but required
                          by RFC 2229 */
  CURLcode result;

  char *path;

  *done = TRUE; /* unconditionally */

  /* url-decode path before further evaluation */
  result = Curl_urldecode(data->state.up.path, 0, &path, NULL, REJECT_CTRL);
  if(result)
    return result;

  if(strncasecompare(path, DICT_MATCH, sizeof(DICT_MATCH)-1) ||
     strncasecompare(path, DICT_MATCH2, sizeof(DICT_MATCH2)-1) ||
     strncasecompare(path, DICT_MATCH3, sizeof(DICT_MATCH3)-1)) {

    word = strchr(path, ':');
    if(word) {
      word++;
      database = strchr(word, ':');
      if(database) {
        *database++ = (char)0;
        strategy = strchr(database, ':');
        if(strategy) {
          *strategy++ = (char)0;
          nthdef = strchr(strategy, ':');
          if(nthdef) {
            *nthdef = (char)0;
          }
        }
      }
    }

    if(!word || (*word == (char)0)) {
      infof(data, "lookup word is missing");
      word = (char *)"default";
    }
    if(!database || (*database == (char)0)) {
      database = (char *)"!";
    }
    if(!strategy || (*strategy == (char)0)) {
      strategy = (char *)".";
    }

    eword = unescape_word(word);
    if(!eword) {
      result = CURLE_OUT_OF_MEMORY;
      goto error;
    }

    result = sendf(data,
                   "CLIENT " LIBCURL_NAME " " LIBCURL_VERSION "\r\n"
                   "MATCH "
                   "%s "    /* database */
                   "%s "    /* strategy */
                   "%s\r\n" /* word */
                   "QUIT\r\n",
                   database,
                   strategy,
                   eword);

    if(result) {
      failf(data, "Failed sending DICT request");
      goto error;
    }
    Curl_xfer_setup1(data, CURL_XFER_RECV, -1, FALSE); /* no upload */
  }
  else if(strncasecompare(path, DICT_DEFINE, sizeof(DICT_DEFINE)-1) ||
          strncasecompare(path, DICT_DEFINE2, sizeof(DICT_DEFINE2)-1) ||
          strncasecompare(path, DICT_DEFINE3, sizeof(DICT_DEFINE3)-1)) {

    word = strchr(path, ':');
    if(word) {
      word++;
      database = strchr(word, ':');
      if(database) {
        *database++ = (char)0;
        nthdef = strchr(database, ':');
        if(nthdef) {
          *nthdef = (char)0;
        }
      }
    }

    if(!word || (*word == (char)0)) {
      infof(data, "lookup word is missing");
      word = (char *)"default";
    }
    if(!database || (*database == (char)0)) {
      database = (char *)"!";
    }

    eword = unescape_word(word);
    if(!eword) {
      result = CURLE_OUT_OF_MEMORY;
      goto error;
    }

    result = sendf(data,
                   "CLIENT " LIBCURL_NAME " " LIBCURL_VERSION "\r\n"
                   "DEFINE "
                   "%s "     /* database */
                   "%s\r\n"  /* word */
                   "QUIT\r\n",
                   database,
                   eword);

    if(result) {
      failf(data, "Failed sending DICT request");
      goto error;
    }
    Curl_xfer_setup1(data, CURL_XFER_RECV, -1, FALSE);
  }
  else {

    ppath = strchr(path, '/');
    if(ppath) {
      int i;

      ppath++;
      for(i = 0; ppath[i]; i++) {
        if(ppath[i] == ':')
          ppath[i] = ' ';
      }
      result = sendf(data,
                     "CLIENT " LIBCURL_NAME " " LIBCURL_VERSION "\r\n"
                     "%s\r\n"
                     "QUIT\r\n", ppath);
      if(result) {
        failf(data, "Failed sending DICT request");
        goto error;
      }

      Curl_xfer_setup1(data, CURL_XFER_RECV, -1, FALSE);
    }
  }

error:
  free(eword);
  free(path);
  return result;
}